

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TermPass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,MatchCharNode *deferredCharNode,
          bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  Char CVar2;
  Char *pCVar3;
  code *pcVar4;
  CharSet<char16_t> *pCVar5;
  CharSet<char16_t> *pCVar6;
  CountDomain CVar7;
  CountDomain CVar8;
  CountDomain CVar9;
  uint16 uVar10;
  undefined4 uVar11;
  bool bVar12;
  EncodedChar EVar13;
  CharCount CVar14;
  CharCountOrFlag CVar15;
  undefined4 *puVar16;
  EncodedChar *pEVar17;
  MatchCharNode *pMVar18;
  undefined7 extraout_var;
  Node *pNVar19;
  char *message;
  uint lineNumber;
  int iVar20;
  MatchCharNode *local_30;
  Node *node;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  local_30 = (MatchCharNode *)0x0;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar12) goto LAB_00ecb3ea;
    *puVar16 = 0;
  }
  pEVar17 = this->next;
  EVar13 = *pEVar17;
  if (0x3e < (ushort)EVar13) {
    switch(EVar13) {
    case L'[':
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      pEVar17 = this->next;
      this->next = pEVar17 + 1;
      if (((this->unicodeFlagPresent == true) &&
          (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0)) &&
         (this->currentSurrogatePairNode->rangeLocation == pEVar17 + 1)) {
        local_30 = (MatchCharNode *)CharacterClassPass1<true>(this);
      }
      else {
        local_30 = (MatchCharNode *)CharacterClassPass1<false>(this);
      }
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      if (*this->next != L']') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x580,"(ECLookahead() == \']\')","ECLookahead() == \']\'");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      break;
    case L'\\':
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      bVar12 = SurrogatePairPass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart);
      if ((!bVar12) &&
         (bVar12 = AtomEscapePass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart),
         bVar12)) {
        return &local_30->super_Node;
      }
      break;
    case L']':
      goto switchD_00eca059_caseD_5d;
    case L'^':
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      pNVar19 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x366bee);
      pNVar19->tag = BOL;
      pNVar19->features = 0;
      goto LAB_00eca75d;
    default:
      if (EVar13 == L'?') goto switchD_00ec9fb6_caseD_2a;
      if (EVar13 == L'|') goto switchD_00ec9fb6_caseD_29;
      goto switchD_00ec9fb6_caseD_25;
    }
    goto LAB_00ecab84;
  }
  switch(EVar13) {
  case L'$':
    if (this->inputLim < pEVar17 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    this->next = this->next + 1;
    pNVar19 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x366bee);
    pNVar19->tag = EOL;
    pNVar19->features = 0;
LAB_00eca75d:
    *(uint *)&pNVar19->field_0xc = *(uint *)&pNVar19->field_0xc & 0xffff8000;
    pNVar19->firstSet = (CharSet<char16_t> *)0x0;
    pNVar19->followSet = (CharSet<char16_t> *)0x0;
    (pNVar19->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar19->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar19->thisConsumes).upper = 0xffffffff;
    (pNVar19->followConsumes).upper = 0xffffffff;
    pNVar19->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558c50;
    return pNVar19;
  case L'%':
  case L'&':
  case L'\'':
  case L',':
  case L'-':
    goto switchD_00ec9fb6_caseD_25;
  case L'(':
    if (this->inputLim < pEVar17 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    pEVar17 = this->next;
    this->next = pEVar17 + 1;
    if (this->inputLim < pEVar17 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    if (*this->next == L'?') {
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      EVar13 = this->next[1];
      if (EVar13 == L'!') {
        ECConsume(this,2);
        local_30 = (MatchCharNode *)DisjunctionPass1(this);
        EVar13 = ECLookahead(this,0);
        if (EVar13 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x54f,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar12) goto LAB_00ecb3ea;
          *puVar16 = 0;
        }
        ECConsume(this,1);
        pMVar18 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (pMVar18->super_Node).tag = Assertion;
        (pMVar18->super_Node).features = 0;
        puVar1 = &(pMVar18->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar18->super_Node).prevConsumes.lower = 0;
        (pMVar18->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar18->super_Node).followSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)&(pMVar18->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar18->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar18->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar18->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559510;
        *(MatchCharNode **)pMVar18->cs = local_30;
        pMVar18->isEquivClass = true;
      }
      else {
        if (EVar13 == L':') {
          ECConsume(this,2);
          local_30 = (MatchCharNode *)DisjunctionPass1(this);
          EVar13 = ECLookahead(this,0);
          if (EVar13 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar16 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x556,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar12) goto LAB_00ecb3ea;
            *puVar16 = 0;
          }
          ECConsume(this,1);
          break;
        }
        if (EVar13 != L'=') {
          iVar20 = this->nextGroupId;
          this->nextGroupId = iVar20 + 1;
          local_30 = (MatchCharNode *)DisjunctionPass1(this);
          EVar13 = ECLookahead(this,0);
          if (EVar13 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar16 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x55e,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar12) goto LAB_00ecb3ea;
            *puVar16 = 0;
          }
          ECConsume(this,1);
          goto LAB_00ecab16;
        }
        ECConsume(this,2);
        local_30 = (MatchCharNode *)DisjunctionPass1(this);
        EVar13 = ECLookahead(this,0);
        if (EVar13 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x548,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar12) goto LAB_00ecb3ea;
          *puVar16 = 0;
        }
        ECConsume(this,1);
        pMVar18 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (pMVar18->super_Node).tag = Assertion;
        (pMVar18->super_Node).features = 0;
        puVar1 = &(pMVar18->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar18->super_Node).prevConsumes.lower = 0;
        (pMVar18->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar18->super_Node).followSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)&(pMVar18->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar18->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar18->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar18->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559510;
        *(MatchCharNode **)pMVar18->cs = local_30;
        pMVar18->isEquivClass = false;
      }
      *(undefined4 *)&pMVar18->field_0x44 = 0;
      local_30 = pMVar18;
    }
    else {
      iVar20 = this->nextGroupId;
      this->nextGroupId = iVar20 + 1;
      local_30 = (MatchCharNode *)DisjunctionPass1(this);
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      if (*this->next != L')') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x56a,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
LAB_00ecab16:
      pMVar18 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x366bee);
      (pMVar18->super_Node).tag = DefineGroup;
      (pMVar18->super_Node).features = 0;
      puVar1 = &(pMVar18->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pMVar18->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pMVar18->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pMVar18->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pMVar18->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pMVar18->super_Node).thisConsumes.upper = 0xffffffff;
      (pMVar18->super_Node).followConsumes.upper = 0xffffffff;
      (pMVar18->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559270;
      *(MatchCharNode **)pMVar18->cs = local_30;
      *(int *)&pMVar18->isEquivClass = iVar20;
      *(undefined4 *)&pMVar18->field_0x44 = 2;
      *(undefined1 *)&pMVar18[1].super_Node._vptr_Node = 0;
      local_30 = pMVar18;
    }
    break;
  case L')':
switchD_00ec9fb6_caseD_29:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    message = "false";
    lineNumber = 0x586;
    goto LAB_00eca2a8;
  case L'*':
  case L'+':
switchD_00ec9fb6_caseD_2a:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    message = "Allowed only in the escaped form. These should be caught by TermPass0.";
    lineNumber = 0x592;
LAB_00eca2a8:
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,lineNumber,"(false)",message);
    if (!bVar12) goto LAB_00ecb3ea;
    *puVar16 = 0;
    break;
  case L'.':
    if (this->inputLim < pEVar17 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    this->next = this->next + 1;
    local_30 = (MatchCharNode *)GetNodeWithValidCharacterSet(this,L'.');
    break;
  default:
    if ((EVar13 == L'\0') && (this->inputLim <= pEVar17)) {
      Fail(this,-0x7ff5ec67);
    }
switchD_00ec9fb6_caseD_25:
    bVar12 = SurrogatePairPass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart);
    if (!bVar12) {
      pEVar17 = this->next;
switchD_00eca059_caseD_5d:
      if (this->inputLim <= pEVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      pCVar3 = this->next;
      this->next = pCVar3 + 1;
      CVar2 = *pCVar3;
      if ((ulong)(ushort)CVar2 < 0x100) {
        bVar12 = (bool)((ASCIIChars::classes[(ushort)CVar2] & 2) >> 1);
      }
      else {
        bVar12 = (CVar2 & 0xfffeU) == 0x2028;
      }
      if (bVar12 != false) {
        Fail(this,-0x7ff5fc0c);
      }
      deferredCharNode->cs[0] = CVar2;
      local_30 = deferredCharNode;
    }
  }
LAB_00ecab84:
  if (local_30 == (MatchCharNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0x5a7,"(node != 0)","node != 0");
    if (!bVar12) goto LAB_00ecb3ea;
    *puVar16 = 0;
  }
  bVar12 = AtQuantifier(this);
  if (!bVar12) {
    return &local_30->super_Node;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar12) goto LAB_00ecb3ea;
    *puVar16 = 0;
  }
  EVar13 = *this->next;
  if ((ushort)EVar13 < 0x3f) {
    if (EVar13 == L'*') {
      if (local_30 == deferredCharNode) {
        local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
        uVar10 = (deferredCharNode->super_Node).features;
        uVar11 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar5 = (deferredCharNode->super_Node).firstSet;
        pCVar6 = (deferredCharNode->super_Node).followSet;
        CVar7 = (deferredCharNode->super_Node).prevConsumes;
        CVar8 = (deferredCharNode->super_Node).thisConsumes;
        CVar9 = (deferredCharNode->super_Node).followConsumes;
        (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_30->super_Node).features = uVar10;
        *(undefined4 *)&(local_30->super_Node).field_0xc = uVar11;
        (local_30->super_Node).firstSet = pCVar5;
        (local_30->super_Node).followSet = pCVar6;
        (local_30->super_Node).prevConsumes = CVar7;
        (local_30->super_Node).thisConsumes = CVar8;
        (local_30->super_Node).followConsumes = CVar9;
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
        *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
        local_30->isEquivClass = deferredCharNode->isEquivClass;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      bVar12 = OptNonGreedy(this);
      CVar14 = 0;
    }
    else {
      if (EVar13 != L'+') goto LAB_00ecafc0;
      if (local_30 == deferredCharNode) {
        local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
        uVar10 = (deferredCharNode->super_Node).features;
        uVar11 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar5 = (deferredCharNode->super_Node).firstSet;
        pCVar6 = (deferredCharNode->super_Node).followSet;
        CVar7 = (deferredCharNode->super_Node).prevConsumes;
        CVar8 = (deferredCharNode->super_Node).thisConsumes;
        CVar9 = (deferredCharNode->super_Node).followConsumes;
        (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_30->super_Node).features = uVar10;
        *(undefined4 *)&(local_30->super_Node).field_0xc = uVar11;
        (local_30->super_Node).firstSet = pCVar5;
        (local_30->super_Node).followSet = pCVar6;
        (local_30->super_Node).prevConsumes = CVar7;
        (local_30->super_Node).thisConsumes = CVar8;
        (local_30->super_Node).followConsumes = CVar9;
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
        *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
        local_30->isEquivClass = deferredCharNode->isEquivClass;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      bVar12 = OptNonGreedy(this);
      CVar14 = 1;
    }
    CVar15 = 0xffffffff;
LAB_00ecb1ee:
    pMVar18 = (MatchCharNode *)NewLoopNode(this,CVar14,CVar15,bVar12,&local_30->super_Node);
    return &pMVar18->super_Node;
  }
  if (EVar13 == L'?') {
    if (local_30 == deferredCharNode) {
      local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
      uVar10 = (deferredCharNode->super_Node).features;
      uVar11 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar5 = (deferredCharNode->super_Node).firstSet;
      pCVar6 = (deferredCharNode->super_Node).followSet;
      CVar7 = (deferredCharNode->super_Node).prevConsumes;
      CVar8 = (deferredCharNode->super_Node).thisConsumes;
      CVar9 = (deferredCharNode->super_Node).followConsumes;
      (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_30->super_Node).features = uVar10;
      *(undefined4 *)&(local_30->super_Node).field_0xc = uVar11;
      (local_30->super_Node).firstSet = pCVar5;
      (local_30->super_Node).followSet = pCVar6;
      (local_30->super_Node).prevConsumes = CVar7;
      (local_30->super_Node).thisConsumes = CVar8;
      (local_30->super_Node).followConsumes = CVar9;
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
      *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
      local_30->isEquivClass = deferredCharNode->isEquivClass;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    this->next = this->next + 1;
    bVar12 = OptNonGreedy(this);
    CVar14 = 0;
    CVar15 = 1;
    goto LAB_00ecb1ee;
  }
  if (EVar13 == L'{') {
    if (local_30 == deferredCharNode) {
      local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
      uVar10 = (deferredCharNode->super_Node).features;
      uVar11 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar5 = (deferredCharNode->super_Node).firstSet;
      pCVar6 = (deferredCharNode->super_Node).followSet;
      CVar7 = (deferredCharNode->super_Node).prevConsumes;
      CVar8 = (deferredCharNode->super_Node).thisConsumes;
      CVar9 = (deferredCharNode->super_Node).followConsumes;
      (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_30->super_Node).features = uVar10;
      *(undefined4 *)&(local_30->super_Node).field_0xc = uVar11;
      (local_30->super_Node).firstSet = pCVar5;
      (local_30->super_Node).followSet = pCVar6;
      (local_30->super_Node).prevConsumes = CVar7;
      (local_30->super_Node).thisConsumes = CVar8;
      (local_30->super_Node).followConsumes = CVar9;
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
      *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
      local_30->isEquivClass = deferredCharNode->isEquivClass;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    this->next = this->next + 1;
    CVar14 = RepeatCount(this);
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00ecb3ea;
      *puVar16 = 0;
    }
    pEVar17 = this->next;
    if (*pEVar17 == L'}') {
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      this->next = this->next + 1;
      bVar12 = OptNonGreedy(this);
      CVar15 = CVar14;
    }
    else {
      if (*pEVar17 != L',') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x5d7,"(false)","false");
        pNVar19 = (Node *)CONCAT71(extraout_var,bVar12);
        if (bVar12) {
          *puVar16 = 0;
          bVar12 = true;
          goto LAB_00ecb3c8;
        }
        goto LAB_00ecb3ea;
      }
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      pEVar17 = this->next;
      this->next = pEVar17 + 1;
      if (this->inputLim < pEVar17 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00ecb3ea;
        *puVar16 = 0;
      }
      if (*this->next == L'}') {
        ECConsume(this,1);
        bVar12 = OptNonGreedy(this);
        CVar15 = 0xffffffff;
      }
      else {
        CVar15 = RepeatCount(this);
        if (CVar15 < CVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x5ce,"(lower <= upper)","lower <= upper");
          if (!bVar12) goto LAB_00ecb3ea;
          *puVar16 = 0;
        }
        EVar13 = ECLookahead(this,0);
        if (EVar13 != L'}') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x5cf,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
          if (!bVar12) goto LAB_00ecb3ea;
          *puVar16 = 0;
        }
        ECConsume(this,1);
        bVar12 = OptNonGreedy(this);
      }
    }
    pNVar19 = NewLoopNode(this,CVar14,CVar15,bVar12,&local_30->super_Node);
    bVar12 = false;
LAB_00ecb3c8:
    if (bVar12) {
      return &local_30->super_Node;
    }
    return pNVar19;
  }
LAB_00ecafc0:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar16 = 1;
  bVar12 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                      ,0x5dd,"(false)","false");
  if (bVar12) {
    *puVar16 = 0;
    return &local_30->super_Node;
  }
LAB_00ecb3ea:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

Node* Parser<P, IsLiteral>::TermPass1(MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        Node* node = 0;
        bool containsSurrogatePair = false;
        switch (ECLookahead())
        {
        case '^':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::BOL); // No quantifier allowed
        case '$':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::EOL); // No quantifier allowed
        case '\\':
            ECConsume();
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; // For quantifier
            }
            else if (AtomEscapePass1(node, deferredCharNode, previousSurrogatePart))
            {
                return node; // No quantifier allowed
            }
            break; // else: fall-through for opt quantifier
        case '(':
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                switch (ECLookahead(1))
                {
                case '=':
                    ECConsume(2); // ?=
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, false, node);
                    break; // As per Annex B, allow this to be quantifiable
                case '!':
                    ECConsume(2); // ?!
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, true, node);
                    break; // As per Annex B, allow this to be quantifiable
                case ':':
                    ECConsume(2); // ?:
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    break; // fall-through for opt quantifier
                default:
                    {
                        // ? not yet consumed
                        int thisGroupId = nextGroupId++;
                        node = DisjunctionPass1();
                        Assert(ECLookahead() == ')');
                        ECConsume(); // )
                        node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                        break; // fall-through for opt quantifier
                    }
                }
                break;
            default:
                {
                    // next char not yet consumed
                    int thisGroupId = nextGroupId++;
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                    break; // fall-through for opt quantifier
                }
            }
            break;
        case '.':
            {
                ECConsume();
                node = GetNodeWithValidCharacterSet('.');
                break; // fall-through for opt quantifier
            }
        case '[':
            ECConsume();
            if (unicodeFlagPresent)
            {
                containsSurrogatePair = this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->rangeLocation == next;
            }

            node = containsSurrogatePair ? CharacterClassPass1<true>() : CharacterClassPass1<false>();

            Assert(ECLookahead() == ']');
            ECConsume(); // ]
            break; // fall-through for opt quantifier
#if DBG
        case ')':
        case '|':
            Assert(false);
            break;
#endif
        case ']':
            // SPEC DEVIATION: This should be syntax error, instead accept as itself
            deferredCharNode->cs[0] = NextChar();
            node = deferredCharNode;
            break; // fall-through for opt quantifier
#if DBG
        case '*':
        case '+':
        case '?':
            AssertMsg(false, "Allowed only in the escaped form. These should be caught by TermPass0.");
            break;
#endif
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; //For quantifier
            }
            else
            {
                deferredCharNode->cs[0] = NextChar();
                node = deferredCharNode;
                break; // fall-through for opt quantifier
            }
        }

        Assert(node != 0);

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, CharCountFlag, OptNonGreedy(), node);
            case '+':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(1, CharCountFlag, OptNonGreedy(), node);
            case '?':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, 1, OptNonGreedy(), node);
            case '{':
                {
                    if (node == deferredCharNode)
                        node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            return NewLoopNode(lower, CharCountFlag, OptNonGreedy(), node);
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            Assert(lower <= upper);
                            Assert(ECLookahead() == '}');
                            ECConsume(); // }
                            return NewLoopNode(lower, upper, OptNonGreedy(), node);
                        }
                    case '}':
                        ECConsume();
                        return NewLoopNode(lower, lower, OptNonGreedy(), node);
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }

        return node;
    }